

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_reader_locate_file_v2
                  (mz_zip_archive *pZip,char *pName,char *pComment,mz_uint flags,mz_uint32 *pIndex)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  bool bVar6;
  int local_120;
  int local_118;
  int local_114;
  int local_10c;
  ulong local_108;
  int local_fc;
  int ofs;
  char *pFile_comment;
  mz_uint file_comment_len;
  mz_uint file_extra_len;
  char *pFilename;
  mz_uint filename_len;
  mz_uint8 *pHeader;
  size_t comment_len;
  size_t name_len;
  mz_uint file_index;
  mz_uint32 *pIndex_local;
  mz_uint flags_local;
  char *pComment_local;
  char *pName_local;
  mz_zip_archive *pZip_local;
  uint local_4c;
  mz_uint i_1;
  uint local_2c;
  mz_uint i;
  
  if (pIndex != (mz_uint32 *)0x0) {
    *pIndex = 0;
  }
  if (((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
     (pName == (char *)0x0)) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    pZip_local._0_4_ = 0;
  }
  else if ((((pZip->m_pState->m_init_flags & 0x800) == 0) &&
           (pZip->m_zip_mode == MZ_ZIP_MODE_READING)) &&
          (((flags & 0x300) == 0 &&
           ((pComment == (char *)0x0 && ((pZip->m_pState->m_sorted_central_dir_offsets).m_size != 0)
            ))))) {
    pZip_local._0_4_ = mz_zip_locate_file_binary_search(pZip,pName,pIndex);
  }
  else {
    sVar4 = strlen(pName);
    if (sVar4 < 0x10000) {
      if (pComment == (char *)0x0) {
        local_108 = 0;
      }
      else {
        local_108 = strlen(pComment);
      }
      if (local_108 < 0x10000) {
        for (name_len._4_4_ = 0; name_len._4_4_ < pZip->m_total_files;
            name_len._4_4_ = name_len._4_4_ + 1) {
          pvVar5 = (pZip->m_pState->m_central_dir).m_p;
          uVar1 = *(uint *)((long)(pZip->m_pState->m_central_dir_offsets).m_p +
                           (ulong)name_len._4_4_ * 4);
          pFilename._4_4_ = (uint)*(ushort *)((long)pvVar5 + (ulong)uVar1 + 0x1c);
          _file_comment_len = (void *)((long)pvVar5 + (ulong)uVar1 + 0x2e);
          if (sVar4 <= pFilename._4_4_) {
            if (local_108 == 0) {
LAB_0010ddcc:
              if (((flags & 0x200) != 0) && (pFilename._4_4_ != 0)) {
                local_fc = pFilename._4_4_ - 1;
                do {
                  if (((*(char *)((long)_file_comment_len + (long)local_fc) == '/') ||
                      (*(char *)((long)_file_comment_len + (long)local_fc) == '\\')) ||
                     (*(char *)((long)_file_comment_len + (long)local_fc) == ':')) break;
                  local_fc = local_fc + -1;
                } while (-1 < local_fc);
                _file_comment_len = (void *)((long)_file_comment_len + (long)(local_fc + 1));
                pFilename._4_4_ = pFilename._4_4_ - (local_fc + 1);
              }
              if (pFilename._4_4_ == sVar4) {
                if ((flags & 0x100) == 0) {
                  for (local_4c = 0; local_4c < pFilename._4_4_; local_4c = local_4c + 1) {
                    if ((pName[local_4c] < 'A') || ('Z' < pName[local_4c])) {
                      local_118 = (int)pName[local_4c];
                    }
                    else {
                      local_118 = pName[local_4c] + 0x20;
                    }
                    if ((*(char *)((long)_file_comment_len + (ulong)local_4c) < 'A') ||
                       ('Z' < *(char *)((long)_file_comment_len + (ulong)local_4c))) {
                      local_120 = (int)*(char *)((long)_file_comment_len + (ulong)local_4c);
                    }
                    else {
                      local_120 = *(char *)((long)_file_comment_len + (ulong)local_4c) + 0x20;
                    }
                    if (local_118 != local_120) {
                      bVar6 = false;
                      goto LAB_0010dfe7;
                    }
                  }
                  bVar6 = true;
                }
                else {
                  iVar3 = memcmp(pName,_file_comment_len,(ulong)pFilename._4_4_);
                  bVar6 = iVar3 == 0;
                }
LAB_0010dfe7:
                if (bVar6) {
                  if (pIndex != (mz_uint32 *)0x0) {
                    *pIndex = name_len._4_4_;
                  }
                  return 1;
                }
              }
            }
            else {
              uVar2 = (uint)*(ushort *)((long)pvVar5 + (ulong)uVar1 + 0x20);
              pvVar5 = (void *)((long)_file_comment_len +
                               (ulong)*(ushort *)((long)pvVar5 + (ulong)uVar1 + 0x1e) +
                               (ulong)pFilename._4_4_);
              if (uVar2 == local_108) {
                if ((flags & 0x100) == 0) {
                  for (local_2c = 0; local_2c < uVar2; local_2c = local_2c + 1) {
                    if ((pComment[local_2c] < 'A') || ('Z' < pComment[local_2c])) {
                      local_10c = (int)pComment[local_2c];
                    }
                    else {
                      local_10c = pComment[local_2c] + 0x20;
                    }
                    if ((*(char *)((long)pvVar5 + (ulong)local_2c) < 'A') ||
                       ('Z' < *(char *)((long)pvVar5 + (ulong)local_2c))) {
                      local_114 = (int)*(char *)((long)pvVar5 + (ulong)local_2c);
                    }
                    else {
                      local_114 = *(char *)((long)pvVar5 + (ulong)local_2c) + 0x20;
                    }
                    if (local_10c != local_114) {
                      bVar6 = false;
                      goto LAB_0010ddbf;
                    }
                  }
                  bVar6 = true;
                }
                else {
                  iVar3 = memcmp(pComment,pvVar5,(ulong)uVar2);
                  bVar6 = iVar3 == 0;
                }
LAB_0010ddbf:
                if (bVar6) goto LAB_0010ddcc;
              }
            }
          }
        }
        if (pZip != (mz_zip_archive *)0x0) {
          pZip->m_last_error = MZ_ZIP_FILE_NOT_FOUND;
        }
        pZip_local._0_4_ = 0;
      }
      else {
        if (pZip != (mz_zip_archive *)0x0) {
          pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
        }
        pZip_local._0_4_ = 0;
      }
    }
    else {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      }
      pZip_local._0_4_ = 0;
    }
  }
  return (mz_bool)pZip_local;
}

Assistant:

mz_bool mz_zip_reader_locate_file_v2(mz_zip_archive *pZip, const char *pName,
                                     const char *pComment, mz_uint flags,
                                     mz_uint32 *pIndex) {
  mz_uint file_index;
  size_t name_len, comment_len;

  if (pIndex)
    *pIndex = 0;

  if ((!pZip) || (!pZip->m_pState) || (!pName))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  /* See if we can use a binary search */
  if (((pZip->m_pState->m_init_flags &
        MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0) &&
      (pZip->m_zip_mode == MZ_ZIP_MODE_READING) &&
      ((flags & (MZ_ZIP_FLAG_IGNORE_PATH | MZ_ZIP_FLAG_CASE_SENSITIVE)) == 0) &&
      (!pComment) && (pZip->m_pState->m_sorted_central_dir_offsets.m_size)) {
    return mz_zip_locate_file_binary_search(pZip, pName, pIndex);
  }

  /* Locate the entry by scanning the entire central directory */
  name_len = strlen(pName);
  if (name_len > MZ_UINT16_MAX)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  comment_len = pComment ? strlen(pComment) : 0;
  if (comment_len > MZ_UINT16_MAX)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  for (file_index = 0; file_index < pZip->m_total_files; file_index++) {
    const mz_uint8 *pHeader = &MZ_ZIP_ARRAY_ELEMENT(
        &pZip->m_pState->m_central_dir, mz_uint8,
        MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32,
                             file_index));
    mz_uint filename_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    const char *pFilename =
        (const char *)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;
    if (filename_len < name_len)
      continue;
    if (comment_len) {
      mz_uint file_extra_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_EXTRA_LEN_OFS),
              file_comment_len =
                  MZ_READ_LE16(pHeader + MZ_ZIP_CDH_COMMENT_LEN_OFS);
      const char *pFile_comment = pFilename + filename_len + file_extra_len;
      if ((file_comment_len != comment_len) ||
          (!mz_zip_string_equal(pComment, pFile_comment, file_comment_len,
                                flags)))
        continue;
    }
    if ((flags & MZ_ZIP_FLAG_IGNORE_PATH) && (filename_len)) {
      int ofs = filename_len - 1;
      do {
        if ((pFilename[ofs] == '/') || (pFilename[ofs] == '\\') ||
            (pFilename[ofs] == ':'))
          break;
      } while (--ofs >= 0);
      ofs++;
      pFilename += ofs;
      filename_len -= ofs;
    }
    if ((filename_len == name_len) &&
        (mz_zip_string_equal(pName, pFilename, filename_len, flags))) {
      if (pIndex)
        *pIndex = file_index;
      return MZ_TRUE;
    }
  }

  return mz_zip_set_error(pZip, MZ_ZIP_FILE_NOT_FOUND);
}